

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

void Gia_ManResubPrintLit(Vec_Int_t *vRes,int nVars,int iLit)

{
  int iVar1;
  uint uVar2;
  int fCompl;
  char *__format;
  char *pcVar3;
  
  iVar1 = Abc_Lit2Var(iLit);
  if (iVar1 < nVars) {
    iVar1 = Abc_LitIsCompl(iLit);
    pcVar3 = "~";
    if (iVar1 == 0) {
      pcVar3 = "";
    }
    iVar1 = Abc_Lit2Var(iLit);
    if ((uint)nVars < 0x1a) {
      uVar2 = iVar1 + 0x5f;
      __format = "%s%c";
    }
    else {
      uVar2 = iVar1 - 2;
      __format = "%si%d";
    }
    printf(__format,pcVar3,(ulong)uVar2);
    return;
  }
  iVar1 = Abc_Lit2Var(iLit);
  fCompl = Abc_LitIsCompl(iLit);
  Gia_ManResubPrintNode(vRes,nVars,iVar1 - nVars,fCompl);
  return;
}

Assistant:

void Gia_ManResubPrintLit( Vec_Int_t * vRes, int nVars, int iLit )
{
    if ( Abc_Lit2Var(iLit) < nVars )
    {
        if ( nVars < 26 )
            printf( "%s%c", Abc_LitIsCompl(iLit) ? "~":"", 'a' + Abc_Lit2Var(iLit)-2 );
        else
            printf( "%si%d", Abc_LitIsCompl(iLit) ? "~":"", Abc_Lit2Var(iLit)-2 );
    }
    else
        Gia_ManResubPrintNode( vRes, nVars, Abc_Lit2Var(iLit) - nVars, Abc_LitIsCompl(iLit) );
}